

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnView::resizeEvent(QColumnView *this,QResizeEvent *event)

{
  bool bVar1;
  int iVar2;
  QResizeEvent *in_RSI;
  undefined8 in_RDI;
  QColumnViewPrivate *in_stack_00000018;
  int diff;
  QColumnViewPrivate *d;
  QColumnViewPrivate *in_stack_00000040;
  QResizeEvent *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int max;
  
  max = (int)((ulong)in_RDI >> 0x20);
  d_func((QColumnView *)0x864071);
  QColumnViewPrivate::doLayout(in_stack_00000040);
  QColumnViewPrivate::updateScrollbars(in_stack_00000018);
  bVar1 = QWidget::isRightToLeft((QWidget *)0x864094);
  if (!bVar1) {
    QResizeEvent::oldSize(in_RSI);
    in_stack_ffffffffffffffd4 = QSize::width((QSize *)0x8640ae);
    QResizeEvent::size(in_RSI);
    iVar2 = QSize::width((QSize *)0x8640c4);
    if (in_stack_ffffffffffffffd4 - iVar2 < 0) {
      QAbstractScrollArea::horizontalScrollBar
                ((QAbstractScrollArea *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      bVar1 = QWidget::isVisible((QWidget *)0x8640e9);
      if (bVar1) {
        QAbstractScrollArea::horizontalScrollBar
                  ((QAbstractScrollArea *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        in_stack_ffffffffffffffd0 =
             QAbstractSlider::value
                       ((QAbstractSlider *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        QAbstractScrollArea::horizontalScrollBar
                  ((QAbstractScrollArea *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar2 = QAbstractSlider::maximum
                          ((QAbstractSlider *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (in_stack_ffffffffffffffd0 == iVar2) {
          in_stack_ffffffffffffffc8 =
               (QResizeEvent *)
               QAbstractScrollArea::horizontalScrollBar
                         ((QAbstractScrollArea *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          QAbstractScrollArea::horizontalScrollBar
                    ((QAbstractScrollArea *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          QAbstractSlider::maximum
                    ((QAbstractSlider *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          QAbstractSlider::setMaximum
                    ((QAbstractSlider *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),max);
        }
      }
    }
  }
  QAbstractItemView::resizeEvent
            ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void QColumnView::resizeEvent(QResizeEvent *event)
{
    Q_D(QColumnView);
    d->doLayout();
    d->updateScrollbars();
    if (!isRightToLeft()) {
        int diff = event->oldSize().width() - event->size().width();
        if (diff < 0 && horizontalScrollBar()->isVisible()
            && horizontalScrollBar()->value() == horizontalScrollBar()->maximum()) {
            horizontalScrollBar()->setMaximum(horizontalScrollBar()->maximum() + diff);
        }
    }
    QAbstractItemView::resizeEvent(event);
}